

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O3

void __thiscall doublechecked::Roaring::flip(Roaring *this,uint64_t range_start,uint64_t range_end)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  iterator __position;
  uint64_t i;
  ulong uVar3;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this_00;
  bool bVar4;
  uint local_3c;
  _Alloc_node local_38;
  
  roaring_bitmap_flip_inplace((roaring_bitmap_t *)this,range_start,range_end);
  if (range_start < range_end) {
    uVar3 = 0x100000000;
    if (range_end < 0x100000000) {
      uVar3 = range_end;
    }
    p_Var1 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    __position._M_node = &p_Var1->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar4]) {
      bVar4 = p_Var2[1]._M_color < (_Rb_tree_color)range_start;
      if (!bVar4) {
        __position._M_node = p_Var2;
      }
    }
    if (range_start < uVar3) {
      this_00 = &this->check;
      do {
        if (((_Rb_tree_header *)__position._M_node == p_Var1) ||
           (range_start < __position._M_node[1]._M_color)) {
          local_3c = (uint)range_start;
          local_38._M_t = &this_00->_M_t;
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::
          _M_insert_unique_<unsigned_int,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)this_00,(const_iterator)__position._M_node,&local_3c,&local_38);
        }
        else {
          __position = std::
                       _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                       ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                           *)this_00,__position._M_node);
        }
        range_start = range_start + 1;
      } while (uVar3 != range_start);
    }
  }
  return;
}

Assistant:

void flip(uint64_t range_start, uint64_t range_end) {
        plain.flip(range_start, range_end);

        if (range_start < range_end) {
            if (range_end >= UINT64_C(0x100000000))
                range_end = UINT64_C(0x100000000);
            auto hint = check.lower_bound(range_start);  // *hint stays as >= i
            auto it_end = check.end();
            for (uint64_t i = range_start; i < range_end; ++i) {
                if (hint == it_end || *hint > i)  // i not present, so add
                    check.insert(hint, i);        // leave hint past i
                else  // *hint == i, must adjust hint and erase
                    hint = check.erase(hint);  // returns *following* iterator
            }
        }
    }